

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O1

Vector<128> * __thiscall
Matrix<128,_784>::operator*
          (Vector<128> *__return_storage_ptr__,Matrix<128,_784> *this,Vector<784> *vector)

{
  pointer pdVar1;
  pointer pvVar2;
  long lVar3;
  pointer __s;
  long lVar4;
  int i;
  long lVar5;
  value_type *__val;
  double dVar6;
  
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x400);
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = __s;
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x80;
  lVar5 = 0;
  memset(__s,0,0x400);
  (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x80;
  pdVar1 = (vector->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar2 = (this->m_Matrix).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    lVar3 = *(long *)&pvVar2[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar6 = __s[lVar5];
    lVar4 = 0;
    do {
      dVar6 = dVar6 + pdVar1[lVar4] * *(double *)(lVar3 + lVar4 * 8);
      __s[lVar5] = dVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x310);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x80);
  return __return_storage_ptr__;
}

Assistant:

Vector<ROWS> operator*(const Vector<COLS> &vector) const
    {
        Vector<ROWS> result{};
        for (int i = 0; i < ROWS; ++i)
        {
            for (int j = 0; j < COLS; ++j)
            {
                result[i] += vector[j] * m_Matrix[i][j];
            }
        }

        return result;
    }